

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::ProgressTask::update(ProgressTask *this)

{
  uint *puVar1;
  uint local_1c [3];
  ProgressTask *pPStack_10;
  index_t new_percent;
  ProgressTask *this_local;
  
  local_1c[1] = 100;
  local_1c[0] = (this->step_ * 100) / this->max_steps_;
  pPStack_10 = this;
  puVar1 = std::min<unsigned_int>(local_1c + 1,local_1c);
  local_1c[2] = *puVar1;
  if ((local_1c[2] != this->percent_) && (this->percent_ = local_1c[2], (this->quiet_ & 1U) == 0)) {
    anon_unknown.dwarf_5292d::task_progress(this->step_,this->percent_);
  }
  return;
}

Assistant:

void ProgressTask::update() {
	index_t new_percent =
	    std::min(index_t(100), index_t(step_ * 100 / max_steps_));
	if(new_percent != percent_) {
	    percent_ = new_percent;
	    if(!quiet_) {
		task_progress(step_, percent_);
	    }
	}
    }